

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.cpp
# Opt level: O1

AdsHandle * __thiscall
AdsDevice::GetHandle
          (AdsHandle *__return_storage_ptr__,AdsDevice *this,uint32_t indexGroup,
          uint32_t indexOffset,AdsNotificationAttrib *notificationAttributes,
          PAdsNotificationFuncEx callback,uint32_t hUser)

{
  uint32_t uVar1;
  long adsErrorCode;
  uint *puVar2;
  AdsException *this_00;
  uint32_t local_6c;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  
  local_6c = 0;
  adsErrorCode = AdsSyncAddDeviceNotificationReqEx
                           (*(this->m_LocalPort)._M_t.
                             super___uniq_ptr_impl<const_long,_ResourceDeleter<const_long>_>._M_t.
                             super__Tuple_impl<0UL,_const_long_*,_ResourceDeleter<const_long>_>.
                             super__Head_base<0UL,_const_long_*,_false>._M_head_impl,&this->m_Addr,
                            indexGroup,indexOffset,notificationAttributes,callback,hUser,&local_6c);
  uVar1 = local_6c;
  if ((adsErrorCode == 0) && (local_6c != 0)) {
    puVar2 = (uint *)operator_new(4);
    *puVar2 = uVar1;
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_68._M_unused._M_object = operator_new(0x18);
    *(code **)local_68._M_unused._0_8_ = DeleteNotificationHandle;
    *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
    *(AdsDevice **)((long)local_68._M_unused._0_8_ + 0x10) = this;
    pcStack_50 = std::
                 _Function_handler<long_(unsigned_int),_std::_Bind<long_(AdsDevice::*(const_AdsDevice_*,_std::_Placeholder<1>))(unsigned_int)_const>_>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<long_(unsigned_int),_std::_Bind<long_(AdsDevice::*(const_AdsDevice_*,_std::_Placeholder<1>))(unsigned_int)_const>_>
               ::_M_manager;
    std::function<long_(unsigned_int)>::function
              ((function<long_(unsigned_int)> *)&local_48,(function<long_(unsigned_int)> *)&local_68
              );
    std::function<long_(unsigned_int)>::function
              ((function<long_(unsigned_int)> *)__return_storage_ptr__,
               (function<long_(unsigned_int)> *)&local_48);
    (__return_storage_ptr__->_M_t).
    super___uniq_ptr_impl<unsigned_int,_ResourceDeleter<unsigned_int>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_ResourceDeleter<unsigned_int>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar2;
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    return __return_storage_ptr__;
  }
  this_00 = (AdsException *)__cxa_allocate_exception(0x30);
  AdsException::AdsException(this_00,adsErrorCode);
  __cxa_throw(this_00,&AdsException::typeinfo,AdsException::~AdsException);
}

Assistant:

AdsHandle AdsDevice::GetHandle(const uint32_t               indexGroup,
                               const uint32_t               indexOffset,
                               const AdsNotificationAttrib& notificationAttributes,
                               PAdsNotificationFuncEx       callback,
                               const uint32_t               hUser) const
{
    uint32_t handle = 0;
    auto error = AdsSyncAddDeviceNotificationReqEx(
        *m_LocalPort, &m_Addr,
        indexGroup, indexOffset,
        &notificationAttributes,
        callback,
        hUser,
        &handle);
    if (error || !handle) {
        throw AdsException(error);
    }
    handle = bhf::ads::letoh(handle);
    return {new uint32_t {handle}, {std::bind(&AdsDevice::DeleteNotificationHandle, this, std::placeholders::_1)}};
}